

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall Cleaner::DoCleanRule(Cleaner *this,Rule *rule)

{
  bool bVar1;
  __type _Var2;
  reference ppEVar3;
  Rule *this_00;
  string *psVar4;
  string *__rhs;
  reference ppNVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_38;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_30;
  iterator out_node;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_20;
  iterator e;
  Rule *rule_local;
  Cleaner *this_local;
  
  e._M_current = (Edge **)rule;
  if (rule == (Rule *)0x0) {
    __assert_fail("rule",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean.cc"
                  ,0xc9,"void Cleaner::DoCleanRule(const Rule *)");
  }
  local_20._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->state_->edges_);
  while( true ) {
    out_node._M_current =
         (Node **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->state_->edges_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       &out_node);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_20);
    this_00 = Edge::rule(*ppEVar3);
    psVar4 = Rule::name_abi_cxx11_(this_00);
    __rhs = Rule::name_abi_cxx11_((Rule *)e._M_current);
    _Var2 = std::operator==(psVar4,__rhs);
    if (_Var2) {
      ppEVar3 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                ::operator*(&local_20);
      local_30._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar3)->outputs_);
      while( true ) {
        ppEVar3 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_20);
        local_38._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar3)->outputs_);
        bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
        if (!bVar1) break;
        ppNVar5 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_30);
        psVar4 = Node::path_abi_cxx11_(*ppNVar5);
        Remove(this,psVar4);
        ppEVar3 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_20);
        RemoveEdgeFiles(this,*ppEVar3);
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_30);
      }
    }
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_20);
  }
  return;
}

Assistant:

void Cleaner::DoCleanRule(const Rule* rule) {
  assert(rule);

  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    if ((*e)->rule().name() == rule->name()) {
      for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
           out_node != (*e)->outputs_.end(); ++out_node) {
        Remove((*out_node)->path());
        RemoveEdgeFiles(*e);
      }
    }
  }
}